

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O2

void RC2_encrypt(ulong *data,RC2_KEY *key)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint *puVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  
  uVar5 = (uint)*data;
  uVar4 = *(uint *)((long)data + 4);
  uVar9 = uVar5 >> 0x10;
  uVar2 = uVar4 >> 0x10;
  iVar6 = 5;
  iVar8 = 3;
  puVar10 = key->data;
  while( true ) {
    do {
      uVar1 = (ushort)uVar2;
      uVar13 = (ushort)uVar4;
      uVar11 = (uVar1 & uVar13) + (short)uVar5 + (~uVar1 & (ushort)uVar9) + (short)*puVar10;
      uVar5 = (uint)(uVar11 >> 0xf) + (uint)uVar11 * 2;
      uVar11 = (ushort)uVar5;
      uVar12 = (uVar11 & uVar1) + (ushort)uVar9 + (~uVar11 & uVar13) + *(short *)((long)puVar10 + 2)
      ;
      uVar9 = (uint)(uVar12 >> 0xe) + (uint)uVar12 * 4;
      uVar12 = (ushort)uVar9;
      uVar13 = (uVar12 & uVar11) + uVar13 + (~uVar12 & uVar1) + (short)puVar10[1];
      uVar4 = (uint)(uVar13 >> 0xd) + (uint)uVar13 * 8;
      uVar13 = ((ushort)uVar4 & uVar12) + uVar1 + (~(ushort)uVar4 & uVar11) +
               *(short *)((long)puVar10 + 6);
      puVar10 = puVar10 + 2;
      uVar7 = (uint)uVar13 << 5;
      uVar3 = (uint)(uVar13 >> 0xb);
      uVar2 = uVar3 | uVar7;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) break;
    iVar6 = (iVar8 == 2) + 5;
    uVar5 = (uVar5 & 0xffff) +
            (uint)*(ushort *)((long)key->data + (ulong)(uVar3 | uVar7 & 0x3f) * 2);
    uVar9 = (uVar9 & 0xffff) + (uint)*(ushort *)((long)key->data + (ulong)(uVar5 & 0x3f) * 2);
    uVar4 = (uVar4 & 0xffff) + (uint)*(ushort *)((long)key->data + (ulong)(uVar9 & 0x3f) * 2);
    uVar2 = uVar2 + *(ushort *)((long)key->data + (ulong)(uVar4 & 0x3f) * 2);
  }
  *(uint *)data = (uVar9 & 0xffff) << 0x10 | uVar5 & 0xffff;
  *(uint *)((long)data + 4) = uVar2 << 0x10 | uVar4 & 0xffff;
  return;
}

Assistant:

static void RC2_encrypt(uint32_t *d, RC2_KEY *key) {
  int i, n;
  uint16_t *p0, *p1;
  uint16_t x0, x1, x2, x3, t;
  uint32_t l;

  l = d[0];
  x0 = (uint16_t)l & 0xffff;
  x1 = (uint16_t)(l >> 16L);
  l = d[1];
  x2 = (uint16_t)l & 0xffff;
  x3 = (uint16_t)(l >> 16L);

  n = 3;
  i = 5;

  p0 = p1 = &key->data[0];
  for (;;) {
    t = (x0 + (x1 & ~x3) + (x2 & x3) + *(p0++)) & 0xffff;
    x0 = (t << 1) | (t >> 15);
    t = (x1 + (x2 & ~x0) + (x3 & x0) + *(p0++)) & 0xffff;
    x1 = (t << 2) | (t >> 14);
    t = (x2 + (x3 & ~x1) + (x0 & x1) + *(p0++)) & 0xffff;
    x2 = (t << 3) | (t >> 13);
    t = (x3 + (x0 & ~x2) + (x1 & x2) + *(p0++)) & 0xffff;
    x3 = (t << 5) | (t >> 11);

    if (--i == 0) {
      if (--n == 0) {
        break;
      }
      i = (n == 2) ? 6 : 5;

      x0 += p1[x3 & 0x3f];
      x1 += p1[x0 & 0x3f];
      x2 += p1[x1 & 0x3f];
      x3 += p1[x2 & 0x3f];
    }
  }

  d[0] = (uint32_t)(x0 & 0xffff) | ((uint32_t)(x1 & 0xffff) << 16L);
  d[1] = (uint32_t)(x2 & 0xffff) | ((uint32_t)(x3 & 0xffff) << 16L);
}